

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

string * __thiscall
ktx::DiffArray<unsigned_char,8ul>::value_abi_cxx11_
          (DiffArray<unsigned_char,_8UL> *this,size_t index,OutputFormat format)

{
  format_string<const_std::__cxx11::basic_string<char>_&,_const_unsigned_char_&> fmt;
  undefined1 uVar1;
  byte bVar2;
  size_t sVar3;
  int in_ECX;
  char *extraout_RDX;
  v10 *this_00;
  string *in_RDI;
  string comma;
  size_t arrayIndex;
  bool first;
  stringstream formattedValue;
  char *space;
  bool *in_stack_fffffffffffffb18;
  size_t *psVar4;
  DiffBase<std::array<unsigned_char,_8UL>_> *in_stack_fffffffffffffb20;
  array<unsigned_char,_8UL> *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  char **in_stack_fffffffffffffb48;
  allocator<char> *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  uchar *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  string *psVar5;
  string local_460 [32];
  char *local_440;
  size_t local_438;
  allocator<char> local_429;
  string local_428 [36];
  undefined4 local_404;
  char *local_400;
  char *local_3f8;
  char *local_3f0 [2];
  byte local_3de;
  undefined1 local_3dd [21];
  string local_3c8 [32];
  ulong local_3a8;
  undefined1 local_399;
  stringstream local_398 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388 [8];
  format_args in_stack_fffffffffffffd88;
  string_view in_stack_fffffffffffffd98;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_210 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8 [3];
  undefined8 local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1c8;
  char *local_1c0;
  uchar *local_1b8;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_1b0;
  char *local_1a8;
  uchar *puStack_1a0;
  string *local_198;
  char **local_190;
  char *local_188;
  uchar *puStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_178;
  undefined8 *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_168;
  undefined8 local_160;
  undefined8 *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_150;
  char *local_148;
  char **local_140;
  char *local_138;
  char **local_130;
  char *local_128;
  char **local_120;
  char *local_118;
  char **local_110;
  undefined1 local_108 [56];
  undefined8 local_d0;
  undefined1 *local_c8;
  char *local_c0;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_b0;
  string *local_a8;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  *local_a0;
  char *local_98;
  size_t sStack_90;
  char *local_80;
  char **local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  local_210[0]._0_8_ = "";
  if (in_ECX != 2) {
    local_210[0]._0_8_ = " ";
  }
  psVar5 = in_RDI;
  local_210[0]._12_4_ = in_ECX;
  std::__cxx11::stringstream::stringstream(local_398);
  local_399 = 1;
  for (local_3a8 = 0; local_3a8 < 8; local_3a8 = local_3a8 + 1) {
    local_3dd[0x14] = '\0';
    local_3de = 0;
    this_00 = (v10 *)(local_3dd + 0x14);
    uVar1 = std::exchange<bool,bool>((bool *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    if ((bool)uVar1) {
      in_stack_fffffffffffffb78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3dd;
      std::allocator<char>::allocator();
      local_3de = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    }
    else {
      local_140 = local_3f0;
      local_148 = ",{}";
      local_138 = ",{}";
      local_3f0[0] = ",{}";
      local_130 = local_140;
      in_stack_fffffffffffffb70 = (uchar *)std::char_traits<char>::length((char_type *)0x1d02ce);
      local_60 = local_148;
      local_198 = local_3c8;
      local_1a8 = local_3f0[0];
      local_1b0 = local_210;
      local_190 = &local_1a8;
      local_1c0 = local_3f0[0];
      local_1b8 = in_stack_fffffffffffffb70;
      puStack_1a0 = in_stack_fffffffffffffb70;
      local_188 = local_1c0;
      puStack_180 = in_stack_fffffffffffffb70;
      in_stack_fffffffffffffb60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::fmt::v10::
           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*const>
                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
                       *)&local_1b0->string,this_00,(char **)local_198);
      local_170 = &local_1d0;
      local_178 = local_1e8;
      local_160 = 0xc;
      local_1d0 = 0xc;
      in_stack_fffffffffffffb58 = extraout_RDX;
      local_1e8[0] = in_stack_fffffffffffffb60;
      local_168 = local_178;
      local_158 = local_170;
      local_150 = local_178;
      local_1c8 = local_178;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffd98,in_stack_fffffffffffffd88);
    }
    if ((local_3de & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_3dd);
    }
    in_stack_fffffffffffffb40 = local_388;
    local_120 = &local_400;
    local_128 = "{}{}";
    local_118 = "{}{}";
    local_400 = "{}{}";
    in_stack_fffffffffffffb48 = &local_3f8;
    local_110 = local_120;
    in_stack_fffffffffffffb50 =
         (allocator<char> *)std::char_traits<char>::length((char_type *)0x1d04e4);
    *in_stack_fffffffffffffb48 = (char *)in_stack_fffffffffffffb50;
    local_58 = local_128;
    in_stack_fffffffffffffb38 =
         DiffBase<std::array<unsigned_char,_8UL>_>::rawValue
                   (in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18);
    std::array<unsigned_char,_8UL>::operator[]
              ((array<unsigned_char,_8UL> *)in_stack_fffffffffffffb20,
               (size_type)in_stack_fffffffffffffb18);
    fmt.str_.size_ = (size_t)psVar5;
    fmt.str_.data_ = (char *)in_RDI;
    ::fmt::v10::print<std::__cxx11::string_const&,unsigned_char_const&>
              ((ostream *)CONCAT17(uVar1,in_stack_fffffffffffffb80),fmt,in_stack_fffffffffffffb78,
               in_stack_fffffffffffffb70);
    std::__cxx11::string::~string(local_3c8);
  }
  if (local_210[0].int128_value._12_4_ == 0) {
    std::__cxx11::stringstream::str();
  }
  else {
    std::__cxx11::stringstream::str();
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_428);
    if ((bVar2 & 1) == 0) {
      local_78 = &local_440;
      local_80 = "[{}{}{}]";
      local_70 = "[{}{}{}]";
      local_440 = "[{}{}{}]";
      psVar4 = &local_438;
      local_68 = local_78;
      sVar3 = std::char_traits<char>::length((char_type *)0x1d0735);
      *psVar4 = sVar3;
      local_8 = local_80;
      std::__cxx11::stringstream::str();
      local_98 = local_440;
      sStack_90 = local_438;
      local_b0 = local_210;
      local_a8 = local_460;
      local_50 = &local_98;
      local_c0 = local_440;
      local_a0 = local_b0;
      local_48 = local_c0;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*const,std::__cxx11::string,char_const*const>
                (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                 (char **)in_stack_fffffffffffffb38);
      local_30 = &local_d0;
      local_38 = local_108;
      local_20 = 0xcdc;
      local_d0 = 0xcdc;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      local_c8 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffd98,in_stack_fffffffffffffd88);
      std::__cxx11::string::~string(local_460);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      std::allocator<char>::~allocator(&local_429);
    }
  }
  local_404 = 1;
  std::__cxx11::stringstream::~stringstream(local_398);
  return psVar5;
}

Assistant:

virtual std::string value(std::size_t index, OutputFormat format) const override {
        const auto space = format != OutputFormat::json_mini ?  " " : "";

        std::stringstream formattedValue;
        bool first = true;
        for (std::size_t arrayIndex = 0; arrayIndex < N; ++arrayIndex) {
            const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
            fmt::print(formattedValue, "{}{}", comma, DiffBase<std::array<T, N>>::rawValue(index)[arrayIndex]);
        }

        if (format == OutputFormat::text) {
            return formattedValue.str();
        } else {
            if (formattedValue.str().empty()) {
                return "[]";
            } else {
                return fmt::format("[{}{}{}]", space, formattedValue.str(), space);
            }
        }
    }